

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O0

bool __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::CheckReader<mp::SuffixReader<double>>
          (SOLReader2<mp::SOLHandler_Easy> *this,SuffixReader<double> *rd,NLW2_SOLReadResultCode *rr
          )

{
  NLW2_SOLReadResultCode NVar1;
  int iVar2;
  char *format;
  SOLReader2<mp::SOLHandler_Easy> *in_RDX;
  VecReader<std::pair<int,_double>_> *in_RSI;
  SOLReader2<mp::SOLHandler_Easy> *in_RDI;
  SOLReader2<mp::SOLHandler_Easy> *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  NVar1 = VecReader<std::pair<int,_double>_>::ReadResult(in_RSI);
  if (NVar1 == NLW2_SOLRead_Early_EOF) {
    NVar1 = ReportEarlyEof(in_RDX);
    *(NLW2_SOLReadResultCode *)&in_RDX->solh_ = NVar1;
    local_1 = false;
  }
  else {
    NVar1 = VecReader<std::pair<int,_double>_>::ReadResult(in_RSI);
    if (NVar1 == NLW2_SOLRead_Bad_Line) {
      VecReader<std::pair<int,double>>::ErrorMessage_abi_cxx11_
                ((VecReader<std::pair<int,double>> *)in_RSI);
      NVar1 = ReportBadLine(this_00,(string *)in_RSI);
      *(NLW2_SOLReadResultCode *)&in_RDX->solh_ = NVar1;
      local_1 = false;
    }
    else {
      iVar2 = VecReader<std::pair<int,_double>_>::Size(in_RSI);
      if (iVar2 == 0) {
        NVar1 = VecReader<std::pair<int,_double>_>::ReadResult(in_RSI);
        if (NVar1 == NLW2_SOLRead_OK) {
          local_1 = true;
        }
        else {
          VecReader<std::pair<int,double>>::ErrorMessage_abi_cxx11_
                    ((VecReader<std::pair<int,double>> *)in_RSI);
          format = (char *)std::__cxx11::string::c_str();
          serror(in_RDI,format);
          ReportBadFormat(this_00);
          NVar1 = VecReader<std::pair<int,_double>_>::ReadResult(in_RSI);
          *(NLW2_SOLReadResultCode *)&in_RDX->solh_ = NVar1;
          local_1 = false;
        }
      }
      else {
        serror(in_RDI,"vector not read completely");
        NVar1 = ReportBadFormat(this_00);
        *(NLW2_SOLReadResultCode *)&in_RDX->solh_ = NVar1;
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool CheckReader(const Reader& rd, NLW2_SOLReadResultCode& rr) {
    if (NLW2_SOLRead_Early_EOF == rd.ReadResult())
      return (rr=ReportEarlyEof(), false);
    if (NLW2_SOLRead_Bad_Line == rd.ReadResult())
      return (rr=ReportBadLine(rd.ErrorMessage()), false);
    if (rd.Size()) {       // unfinished
      serror("vector not read completely");
      return (rr=ReportBadFormat(), false);
    }
    if (NLW2_SOLRead_OK != rd.ReadResult()) {
      serror( rd.ErrorMessage().c_str() );
      ReportBadFormat();
      return (rr=rd.ReadResult(), false);
    }
    return true;
  }